

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O2

void __thiscall SAUF4C<TTA>::FirstScan(SAUF4C<TTA> *this)

{
  long lVar1;
  uint uVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
  uVar8 = *(uint *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  uVar14 = 0;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar16 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar16 = uVar14;
  }
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar14;
  }
  lVar12 = -1;
  for (; uVar14 != uVar9; uVar14 = uVar14 + 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
    lVar5 = *(long *)&pMVar3->field_0x10;
    lVar6 = **(long **)&pMVar3->field_0x48;
    lVar13 = *(long *)&pMVar4->field_0x10;
    lVar7 = **(long **)&pMVar4->field_0x48;
    lVar1 = lVar13 + lVar7 * uVar14;
    lVar10 = lVar1 + -4;
    lVar11 = lVar6 * uVar14 + lVar5;
    lVar13 = lVar7 * lVar12 + lVar13;
    for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      if (*(char *)(lVar11 + uVar15) != '\0') {
        if ((uVar14 == 0) || (*(char *)(lVar6 * lVar12 + lVar5 + uVar15) == '\0')) {
          if ((uVar15 == 0) || (*(char *)(lVar11 + -1 + uVar15) == '\0')) {
            uVar8 = TTA::NewLabel();
          }
          else {
            uVar8 = *(uint *)(lVar10 + uVar15 * 4);
          }
        }
        else if ((uVar15 == 0) || (*(char *)(lVar11 + -1 + uVar15) == '\0')) {
          uVar8 = *(uint *)(lVar13 + uVar15 * 4);
        }
        else {
          uVar8 = TTA::Merge(*(uint *)(lVar13 + uVar15 * 4),*(uint *)(lVar10 + uVar15 * 4));
        }
        *(uint *)(lVar1 + uVar15 * 4) = uVar8;
      }
    }
    lVar12 = lVar12 + 1;
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_4 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_5 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_4c_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }